

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_common.c
# Opt level: O0

size_t HUF_readStats_body_default
                 (BYTE *huffWeight,size_t hwSize,U32 *rankStats,U32 *nbSymbolsPtr,U32 *tableLogPtr,
                 void *src,size_t srcSize,void *workSpace,size_t wkspSize)

{
  uint uVar1;
  U32 val;
  uint uVar2;
  void *src_local;
  U32 *tableLogPtr_local;
  U32 *nbSymbolsPtr_local;
  U32 *rankStats_local;
  size_t hwSize_local;
  BYTE *huffWeight_local;
  U32 lastWeight;
  U32 verif;
  U32 rest;
  U32 total;
  U32 tableLog;
  U32 n_1;
  U32 n;
  size_t oSize;
  size_t iSize;
  BYTE *ip;
  U32 weightTotal;
  size_t local_10;
  
  if (srcSize == 0) {
    return 0xffffffffffffffb8;
  }
  oSize = (size_t)*src;
  if (oSize < 0x80) {
    if (srcSize < oSize + 1) {
      return 0xffffffffffffffb8;
    }
    _n_1 = FSE_decompress_wksp_bmi2
                     (huffWeight,hwSize - 1,(void *)((long)src + 1),oSize,6,workSpace,wkspSize,0);
    uVar1 = FSE_isError(_n_1);
    if (uVar1 != 0) {
      return _n_1;
    }
  }
  else {
    _n_1 = oSize - 0x7f;
    oSize = oSize - 0x7e >> 1;
    if (srcSize < oSize + 1) {
      return 0xffffffffffffffb8;
    }
    if (hwSize <= _n_1) {
      return 0xffffffffffffffec;
    }
    for (tableLog = 0; tableLog < _n_1; tableLog = tableLog + 2) {
      huffWeight[tableLog] =
           (BYTE)((int)(uint)*(byte *)((long)src + (ulong)(tableLog >> 1) + 1) >> 4);
      huffWeight[tableLog + 1] = *(byte *)((long)src + (ulong)(tableLog >> 1) + 1) & 0xf;
    }
  }
  memset(rankStats,0,0x34);
  ip._0_4_ = 0;
  total = 0;
  while( true ) {
    if (_n_1 <= total) {
      if ((U32)ip == 0) {
        local_10 = 0xffffffffffffffec;
      }
      else {
        uVar1 = BIT_highbit32((U32)ip);
        uVar1 = uVar1 + 1;
        if (uVar1 < 0xd) {
          *tableLogPtr = uVar1;
          val = (1 << ((byte)uVar1 & 0x1f)) - (U32)ip;
          uVar1 = BIT_highbit32(val);
          uVar2 = BIT_highbit32(val);
          uVar2 = uVar2 + 1;
          if (1 << ((byte)uVar1 & 0x1f) == val) {
            huffWeight[_n_1] = (BYTE)uVar2;
            rankStats[uVar2] = rankStats[uVar2] + 1;
            if ((rankStats[1] < 2) || ((rankStats[1] & 1) != 0)) {
              local_10 = 0xffffffffffffffec;
            }
            else {
              *nbSymbolsPtr = (int)_n_1 + 1;
              local_10 = oSize + 1;
            }
          }
          else {
            local_10 = 0xffffffffffffffec;
          }
        }
        else {
          local_10 = 0xffffffffffffffec;
        }
      }
      return local_10;
    }
    if (0xb < huffWeight[total]) break;
    rankStats[huffWeight[total]] = rankStats[huffWeight[total]] + 1;
    ip._0_4_ = ((1 << (huffWeight[total] & 0x1f)) >> 1) + (U32)ip;
    total = total + 1;
  }
  return 0xffffffffffffffec;
}

Assistant:

static size_t HUF_readStats_body_default(BYTE* huffWeight, size_t hwSize, U32* rankStats,
                     U32* nbSymbolsPtr, U32* tableLogPtr,
                     const void* src, size_t srcSize,
                     void* workSpace, size_t wkspSize)
{
    return HUF_readStats_body(huffWeight, hwSize, rankStats, nbSymbolsPtr, tableLogPtr, src, srcSize, workSpace, wkspSize, 0);
}